

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx-prettyprint.h
# Opt level: O2

string * pretty_print::
         quoting_handler<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>_>
         ::toString(string *__return_storage_ptr__,
                   pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>
                   *x)

{
  ostringstream out;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_190,x);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(const T& x)
        {
            std::ostringstream out;
            out << x;
            return out.str();
        }